

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckEqualsWithStringsFailsOnDifferentStrings::RunImpl
          (TestCheckEqualsWithStringsFailsOnDifferentStrings *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_90;
  int local_6c [5];
  TestDetails local_58;
  undefined1 local_38 [8];
  TestResults results;
  char acStack_16 [2];
  char txt2 [6];
  char txt1 [6];
  TestCheckEqualsWithStringsFailsOnDifferentStrings *this_local;
  
  _acStack_16 = 0x6c6c6548;
  txt2[2] = 'o';
  txt2[3] = '\0';
  results.m_currentTestFailed = true;
  results._21_3_ = 0x6c6c61;
  unique0x10000158 = this;
  UnitTest::TestResults::TestResults((TestResults *)local_38,(TestReporter *)0x0);
  UnitTest::TestDetails::TestDetails(&local_58,"","","",0);
  UnitTest::CheckEqual((TestResults *)local_38,acStack_16,&results.m_currentTestFailed,&local_58);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_6c[1] = 1;
  local_6c[0] = UnitTest::TestResults::GetFailureCount((TestResults *)local_38);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_90,*ppTVar2,0x17);
  UnitTest::CheckEqual<int,int>(results_00,local_6c + 1,local_6c,&local_90);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsFailsOnDifferentStrings)
{
    char txt1[] = "Hello";
    char txt2[] = "Hallo";
    TestResults results;
    CheckEqual(results, txt1, txt2, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}